

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O1

void read_code(wasm_reader *wr,code_pointer cp)

{
  uint64 uVar1;
  byte bVar2;
  uint32 uVar3;
  uint64 uVar4;
  local_var_info *plVar5;
  ulong uVar6;
  
  uVar4 = (*(wr->wr_op).read_uint64_from_leb128)(wr);
  cp->code_size = uVar4;
  uVar1 = wr->index;
  uVar3 = (*(wr->wr_op).read_uint32_from_leb128)(wr);
  cp->local_var_info_count = uVar3;
  if (uVar3 == 0) {
    plVar5 = (local_var_info *)0x0;
  }
  else {
    plVar5 = (local_var_info *)malloc((ulong)uVar3 << 3);
  }
  cp->lv_info = plVar5;
  if (cp->local_var_info_count != 0) {
    uVar6 = 0;
    do {
      uVar3 = (*(wr->wr_op).read_uint32_from_leb128)(wr);
      cp->lv_info[uVar6].count = uVar3;
      bVar2 = (*(wr->wr_op).read_byte)(wr);
      cp->lv_info[uVar6].type = bVar2;
      uVar6 = uVar6 + 1;
    } while (uVar6 < cp->local_var_info_count);
  }
  (*(wr->wr_op).read_instructions)(wr,&cp->inst);
  check_index(wr,uVar1 + uVar4,"read_code");
  return;
}

Assistant:

void read_code(wasm_reader *wr, code_pointer cp) {
    uint64 right_index;
    uint64 code_size = wr->wr_op.read_uint64_from_leb128(wr);
    cp->code_size = code_size;
    right_index = wr->index + code_size;
    cp->local_var_info_count = wr->wr_op.read_uint32_from_leb128(wr);
    cp->lv_info = cp->local_var_info_count > 0 ? malloc(sizeof(local_var_info) * cp->local_var_info_count) : NULL;
    for (int i = 0; i < cp->local_var_info_count; ++i) {
        cp->lv_info[i].count = wr->wr_op.read_uint32_from_leb128(wr);
        cp->lv_info[i].type = wr->wr_op.read_byte(wr);
    }
    wr->wr_op.read_instructions(wr, &cp->inst);
    check_index(wr, right_index, "read_code");
}